

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManSetMark0Dfs_rec(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)iObj;
  while( true ) {
    iVar4 = (int)uVar5;
    if ((iVar4 < 0) || (p->nObjs <= iVar4)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar2 = *(ulong *)(p->pObjs + uVar5);
    uVar3 = (uint)uVar2;
    if ((uVar3 >> 0x1e & 1) != 0) {
      return;
    }
    pGVar1 = p->pObjs + uVar5;
    *(ulong *)pGVar1 = uVar2 | 0x40000000;
    if ((int)uVar3 < 0) break;
    if ((uVar3 & 0x1fffffff) == 0x1fffffff) {
      return;
    }
    Gia_ManSetMark0Dfs_rec(p,iVar4 - (uVar3 & 0x1fffffff));
    uVar5 = (ulong)(iVar4 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
  }
  return;
}

Assistant:

void Gia_ManSetMark0Dfs_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    pObj = Gia_ManObj( p, iObj );
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Gia_ManSetMark0Dfs_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    Gia_ManSetMark0Dfs_rec( p, Gia_ObjFaninId1(pObj, iObj) );
}